

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void ZopfliDeflate(ZopfliOptions *options,int btype,int final,uchar *in,size_t insize,uchar *bp,
                  uchar **out,size_t *outsize)

{
  long lVar1;
  int *in_RDI;
  ulong in_R8;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *in_stack_00000010;
  size_t size;
  int final2;
  int masterfinal;
  size_t i;
  size_t offset;
  size_t in_stack_00000170;
  size_t in_stack_00000178;
  uchar *in_stack_00000180;
  int in_stack_00000188;
  int in_stack_0000018c;
  ZopfliOptions *in_stack_00000190;
  uchar *in_stack_000001a0;
  uchar **in_stack_000001a8;
  size_t *in_stack_000001b0;
  long local_58;
  ulong local_38;
  
  lVar1 = *in_stack_00000010;
  local_38 = 0;
  do {
    if (local_38 + 1000000 < in_R8) {
      local_58 = 1000000;
    }
    else {
      local_58 = in_R8 - local_38;
    }
    ZopfliDeflatePart(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000180,
                      in_stack_00000178,in_stack_00000170,in_stack_000001a0,in_stack_000001a8,
                      in_stack_000001b0);
    local_38 = local_58 + local_38;
  } while (local_38 < in_R8);
  if (*in_RDI != 0) {
    lVar1 = in_R8 - (*in_stack_00000010 - lVar1);
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    auVar3._8_4_ = (int)(in_R8 >> 0x20);
    auVar3._0_8_ = in_R8;
    auVar3._12_4_ = 0x45300000;
    fprintf(_stderr,"Original Size: %lu, Deflate: %lu, Compression: %f%% Removed\n",
            (((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 100.0) /
            ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0)));
  }
  return;
}

Assistant:

void ZopfliDeflate(const ZopfliOptions* options, int btype, int final,
                   const unsigned char* in, size_t insize,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
 size_t offset = *outsize;
#if ZOPFLI_MASTER_BLOCK_SIZE == 0
  ZopfliDeflatePart(options, btype, final, in, 0, insize, bp, out, outsize);
#else
  size_t i = 0;
  do {
    int masterfinal = (i + ZOPFLI_MASTER_BLOCK_SIZE >= insize);
    int final2 = final && masterfinal;
    size_t size = masterfinal ? insize - i : ZOPFLI_MASTER_BLOCK_SIZE;
    ZopfliDeflatePart(options, btype, final2,
                      in, i, i + size, bp, out, outsize);
    i += size;
  } while (i < insize);
#endif
  if (options->verbose) {
    fprintf(stderr,
            "Original Size: %lu, Deflate: %lu, Compression: %f%% Removed\n",
            (unsigned long)insize, (unsigned long)(*outsize - offset),
            100.0 * (double)(insize - (*outsize - offset)) / (double)insize);
  }
}